

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<soul::Type,_8UL>::reserve
          (ArrayWithPreallocation<soul::Type,_8UL> *this,size_t minSize)

{
  Type *pTVar1;
  ulong uVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  if (this->numAllocated < minSize) {
    uVar2 = minSize + 0xf & 0xfffffffffffffff0;
    if (uVar2 != 0) {
      pTVar1 = (Type *)operator_new__(uVar2 * 0x18);
      lVar3 = 0;
      for (uVar4 = 0; uVar4 < this->numActive; uVar4 = uVar4 + 1) {
        Type::Type((Type *)(&pTVar1->category + lVar3),(Type *)(&this->items->category + lVar3));
        RefCountedPtr<soul::Structure>::~RefCountedPtr
                  ((RefCountedPtr<soul::Structure> *)
                   ((long)&(this->items->structure).object + lVar3));
        lVar3 = lVar3 + 0x18;
      }
      freeIfHeapAllocated(this);
      this->items = pTVar1;
    }
    this->numAllocated = uVar2;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }